

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

int Wln_NtkDupDfs_rec(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  Wln_Vec_t *pWVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (iObj == 0) {
    return 0;
  }
  if ((-1 < iObj) && (iObj < (p->vCopies).nSize)) {
    uVar6 = (ulong)(uint)iObj;
    iVar1 = (p->vCopies).pArray[uVar6];
    if (iVar1 != 0) {
      return iVar1;
    }
    if (iObj < (p->vTypes).nSize) {
      if ((p->vTypes).pArray[uVar6] == 0x59) {
        __assert_fail("!Wln_ObjIsFf(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNtk.c"
                      ,0xbe,"int Wln_NtkDupDfs_rec(Wln_Ntk_t *, Wln_Ntk_t *, int)");
      }
      pWVar2 = p->vFanins;
      uVar4 = (ulong)(uint)pWVar2[uVar6].nSize;
      if (0 < pWVar2[uVar6].nSize) {
        lVar7 = uVar6 * 0x10 + 8;
        lVar5 = 0;
        do {
          if ((int)uVar4 < 3) {
            piVar3 = (int *)((long)&pWVar2->nCap + lVar7);
          }
          else {
            piVar3 = pWVar2[uVar6].field_2.pArray[0] + lVar5;
          }
          if (*piVar3 != 0) {
            Wln_NtkDupDfs_rec(pNew,p,*piVar3);
          }
          lVar5 = lVar5 + 1;
          pWVar2 = p->vFanins;
          uVar4 = (ulong)pWVar2[uVar6].nSize;
          lVar7 = lVar7 + 4;
        } while (lVar5 < (long)uVar4);
      }
      iVar1 = Wln_ObjDup(pNew,p,iObj);
      return iVar1;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_NtkDupDfs_rec( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin;
    if ( iObj == 0 )
        return 0;
    if ( Wln_ObjCopy(p, iObj) )
        return Wln_ObjCopy(p, iObj);
    //printf( "Visiting node %d\n", iObj );
    assert( !Wln_ObjIsFf(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_NtkDupDfs_rec( pNew, p, iFanin );
    return Wln_ObjDup( pNew, p, iObj );
}